

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::OP_Memcopy
               (Var dstInstance,int32 dstStart,Var srcInstance,int32 srcStart,int32 length,
               ScriptContext *scriptContext)

{
  bool bVar1;
  Type TVar2;
  ThreadContext *pTVar3;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  RecyclableObject *pRVar9;
  JavascriptArray *fromArray;
  JavascriptArray *this;
  TypedArray<float,_false,_false> *this_00;
  TypedArray<float,_false,_false> *fromArray_00;
  TypedArray<unsigned_char,_true,_false> *this_01;
  TypedArray<unsigned_char,_true,_false> *fromArray_01;
  TypedArray<double,_false,_false> *this_02;
  TypedArray<double,_false,_false> *fromArray_02;
  TypedArray<short,_false,_false> *this_03;
  TypedArray<short,_false,_false> *fromArray_03;
  TypedArray<unsigned_short,_false,_false> *this_04;
  TypedArray<unsigned_short,_false,_false> *fromArray_04;
  TypedArray<char,_false,_false> *this_05;
  TypedArray<char,_false,_false> *fromArray_05;
  TypedArray<unsigned_char,_false,_false> *this_06;
  TypedArray<unsigned_char,_false,_false> *fromArray_06;
  TypedArray<unsigned_int,_false,_false> *this_07;
  TypedArray<unsigned_int,_false,_false> *fromArray_07;
  TypedArray<int,_false,_false> *this_08;
  TypedArray<int,_false,_false> *fromArray_08;
  Type TVar10;
  uint local_3c;
  
  pTVar3 = scriptContext->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  local_3c = 0;
  if (length < 1) goto LAB_00ab1428;
  if (srcInstance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar6) goto LAB_00ab1447;
    *puVar8 = 0;
LAB_00ab0e37:
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(srcInstance);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_00ab1447;
      *puVar8 = 0;
    }
    TVar2 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar2) && (BVar7 = RecyclableObject::IsExternal(pRVar9), BVar7 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar6) goto LAB_00ab1447;
LAB_00ab0f46:
      *puVar8 = 0;
    }
  }
  else {
    if (((ulong)srcInstance & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)srcInstance & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar6) goto LAB_00ab1447;
      TVar2 = TypeIds_FirstNumberType;
      goto LAB_00ab0f46;
    }
    TVar2 = TypeIds_FirstNumberType;
    if ((((ulong)srcInstance & 0xffff000000000000) != 0x1000000000000) &&
       (TVar2 = TypeIds_Number, (ulong)srcInstance >> 0x32 == 0)) goto LAB_00ab0e37;
  }
  if (dstInstance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar6) goto LAB_00ab1447;
    *puVar8 = 0;
LAB_00ab1020:
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(dstInstance);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_00ab1447;
      *puVar8 = 0;
    }
    TVar10 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar10) && (BVar7 = RecyclableObject::IsExternal(pRVar9), BVar7 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar6) goto LAB_00ab1447;
LAB_00ab10f0:
      *puVar8 = 0;
    }
  }
  else {
    if (((ulong)dstInstance & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)dstInstance & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar6) goto LAB_00ab1447;
      TVar10 = TypeIds_FirstNumberType;
      goto LAB_00ab10f0;
    }
    TVar10 = TypeIds_FirstNumberType;
    if ((((ulong)dstInstance & 0xffff000000000000) != 0x1000000000000) &&
       (TVar10 = TypeIds_Number, (ulong)dstInstance >> 0x32 == 0)) goto LAB_00ab1020;
  }
  if ((srcStart == dstStart) && (TVar2 == TVar10)) {
    switch(TVar2) {
    case TypeIds_Array:
    case TypeIds_NativeIntArray:
    case TypeIds_ArrayLast:
      if (-1 < srcStart) {
        fromArray = UnsafeVarTo<Js::JavascriptArray>(srcInstance);
        this = VarTo<Js::JavascriptArray>(dstInstance);
        bVar6 = ScriptContextOptimizationOverrideInfo::IsEnabledArraySetElementFastPath
                          (&scriptContext->optimizationOverrides);
        if (bVar6) {
          lVar4 = *dstInstance;
          if (TVar2 == TypeIds_NativeIntArray) {
            bVar6 = JavascriptArray::DirectSetItemAtRangeFromArray<int>
                              (this,srcStart,length,fromArray,srcStart);
          }
          else if (TVar2 == TypeIds_Array) {
            bVar6 = JavascriptArray::DirectSetItemAtRangeFromArray<void*>
                              (this,srcStart,length,fromArray,srcStart);
          }
          else {
            bVar6 = JavascriptArray::DirectSetItemAtRangeFromArray<double>
                              (this,srcStart,length,fromArray,srcStart);
          }
          local_3c = (uint)(byte)(lVar4 == *dstInstance & bVar6);
        }
      }
      break;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1439,"(false)","We don\'t support this type for memcopy yet.");
      if (!bVar6) {
LAB_00ab1447:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
      break;
    case TypeIds_Int8Array:
      this_05 = VarTo<Js::TypedArray<char,false,false>>(dstInstance);
      fromArray_05 = VarTo<Js::TypedArray<char,false,false>>(srcInstance);
      local_3c = TypedArray<char,_false,_false>::DirectSetItemAtRange
                           (this_05,fromArray_05,srcStart,srcStart,length,
                            JavascriptConversion::ToInt8);
      break;
    case TypeIds_Uint8Array:
      this_06 = VarTo<Js::TypedArray<unsigned_char,false,false>>(dstInstance);
      fromArray_06 = VarTo<Js::TypedArray<unsigned_char,false,false>>(srcInstance);
      local_3c = TypedArray<unsigned_char,_false,_false>::DirectSetItemAtRange
                           (this_06,fromArray_06,srcStart,srcStart,length,
                            JavascriptConversion::ToUInt8);
      break;
    case TypeIds_Uint8ClampedArray:
      this_01 = VarTo<Js::TypedArray<unsigned_char,true,false>>(dstInstance);
      fromArray_01 = VarTo<Js::TypedArray<unsigned_char,true,false>>(srcInstance);
      local_3c = TypedArray<unsigned_char,_true,_false>::DirectSetItemAtRange
                           (this_01,fromArray_01,srcStart,srcStart,length,
                            JavascriptConversion::ToUInt8Clamped);
      break;
    case TypeIds_Int16Array:
      this_03 = VarTo<Js::TypedArray<short,false,false>>(dstInstance);
      fromArray_03 = VarTo<Js::TypedArray<short,false,false>>(srcInstance);
      local_3c = TypedArray<short,_false,_false>::DirectSetItemAtRange
                           (this_03,fromArray_03,srcStart,srcStart,length,
                            JavascriptConversion::ToInt16);
      break;
    case TypeIds_Uint16Array:
      this_04 = VarTo<Js::TypedArray<unsigned_short,false,false>>(dstInstance);
      fromArray_04 = VarTo<Js::TypedArray<unsigned_short,false,false>>(srcInstance);
      local_3c = TypedArray<unsigned_short,_false,_false>::DirectSetItemAtRange
                           (this_04,fromArray_04,srcStart,srcStart,length,
                            JavascriptConversion::ToUInt16);
      break;
    case TypeIds_Int32Array:
      this_08 = VarTo<Js::TypedArray<int,false,false>>(dstInstance);
      fromArray_08 = VarTo<Js::TypedArray<int,false,false>>(srcInstance);
      local_3c = TypedArray<int,_false,_false>::DirectSetItemAtRange
                           (this_08,fromArray_08,srcStart,srcStart,length,
                            JavascriptConversion::ToInt32);
      break;
    case TypeIds_Uint32Array:
      this_07 = VarTo<Js::TypedArray<unsigned_int,false,false>>(dstInstance);
      fromArray_07 = VarTo<Js::TypedArray<unsigned_int,false,false>>(srcInstance);
      local_3c = TypedArray<unsigned_int,_false,_false>::DirectSetItemAtRange
                           (this_07,fromArray_07,srcStart,srcStart,length,
                            JavascriptConversion::ToUInt32);
      break;
    case TypeIds_Float32Array:
      this_00 = VarTo<Js::TypedArray<float,false,false>>(dstInstance);
      fromArray_00 = VarTo<Js::TypedArray<float,false,false>>(srcInstance);
      local_3c = TypedArray<float,_false,_false>::DirectSetItemAtRange
                           (this_00,fromArray_00,srcStart,srcStart,length,
                            JavascriptConversion::ToFloat);
      break;
    case TypeIds_Float64Array:
      this_02 = VarTo<Js::TypedArray<double,false,false>>(dstInstance);
      fromArray_02 = VarTo<Js::TypedArray<double,false,false>>(srcInstance);
      local_3c = TypedArray<double,_false,_false>::DirectSetItemAtRange
                           (this_02,fromArray_02,srcStart,srcStart,length,
                            JavascriptConversion::ToNumber);
    }
  }
LAB_00ab1428:
  pTVar3->noJsReentrancy = bVar1;
  return local_3c;
}

Assistant:

BOOL JavascriptOperators::OP_Memcopy(Var dstInstance, int32 dstStart, Var srcInstance, int32 srcStart, int32 length, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_Memcopy, reentrancylock, scriptContext->GetThreadContext());
        if (length <= 0)
        {
            return false;
        }

        TypeId instanceType = JavascriptOperators::GetTypeId(srcInstance);

        if (instanceType != JavascriptOperators::GetTypeId(dstInstance))
        {
            return false;
        }

        if (srcStart != dstStart)
        {
            return false;
        }

        BOOL  returnValue = false;
#define MEMCOPY_TYPED_ARRAY(type, conversion) VarTo< type ## >(dstInstance)->DirectSetItemAtRange( VarTo< type ## >(srcInstance), srcStart, dstStart, length, JavascriptConversion:: ## conversion)
        switch (instanceType)
        {
        case TypeIds_Int8Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Int8Array, ToInt8);
            break;
        }
        case TypeIds_Uint8Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Uint8Array, ToUInt8);
            break;
        }
        case TypeIds_Uint8ClampedArray:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Uint8ClampedArray, ToUInt8Clamped);
            break;
        }
        case TypeIds_Int16Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Int16Array, ToInt16);
            break;
        }
        case TypeIds_Uint16Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Uint16Array, ToUInt16);
            break;
        }
        case TypeIds_Int32Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Int32Array, ToInt32);
            break;
        }
        case TypeIds_Uint32Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Uint32Array, ToUInt32);
            break;
        }
        case TypeIds_Float32Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Float32Array, ToFloat);
            break;
        }
        case TypeIds_Float64Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Float64Array, ToNumber);
            break;
        }
        case TypeIds_Array:
        case TypeIds_NativeFloatArray:
        case TypeIds_NativeIntArray:
        {
            if (dstStart < 0 || srcStart < 0)
            {
                // This is not supported, Bailout
                break;
            }
            // Upper bounds check for source array
            JavascriptArray* srcArray = UnsafeVarTo<JavascriptArray>(srcInstance);
            JavascriptArray* dstArray = VarTo<JavascriptArray>(dstInstance);
            if (scriptContext->optimizationOverrides.IsEnabledArraySetElementFastPath())
            {
                INT_PTR vt = VirtualTableInfoBase::GetVirtualTable(dstInstance);
                if (instanceType == TypeIds_Array)
                {
                    returnValue = dstArray->DirectSetItemAtRangeFromArray<Var>(dstStart, length, srcArray, srcStart);
                }
                else if (instanceType == TypeIds_NativeIntArray)
                {
                    returnValue = dstArray->DirectSetItemAtRangeFromArray<int32>(dstStart, length, srcArray, srcStart);
                }
                else
                {
                    returnValue = dstArray->DirectSetItemAtRangeFromArray<double>(dstStart, length, srcArray, srcStart);
                }
                returnValue &= vt == VirtualTableInfoBase::GetVirtualTable(dstInstance);
            }
            break;
        }
        default:
            AssertMsg(false, "We don't support this type for memcopy yet.");
            break;
        }
#undef MEMCOPY_TYPED_ARRAY
        return returnValue;
        JIT_HELPER_END(Op_Memcopy);
    }